

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_histogram(REF_DBL *metric,REF_GRID ref_grid,char *filename)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_DBL *original;
  ulong uVar4;
  REF_INT *sorted_index;
  FILE *__s;
  uint n;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  REF_DBL RVar11;
  REF_DBL diag_system [12];
  
  pRVar1 = ref_grid->node;
  uVar7 = (ulong)pRVar1->n;
  if ((long)uVar7 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xc55,
           "ref_metric_histogram","malloc eig of REF_DBL negative");
LAB_001b821e:
    RVar3 = 1;
  }
  else {
    original = (REF_DBL *)malloc(uVar7 * 8);
    if (original == (REF_DBL *)0x0) {
      pcVar6 = "malloc eig of REF_DBL NULL";
      uVar5 = 0xc55;
    }
    else {
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        original[uVar4] = 0.0;
      }
      sorted_index = (REF_INT *)malloc(uVar7 * 4);
      if (sorted_index == (REF_INT *)0x0) {
        pcVar6 = "malloc sorted_index of REF_INT NULL";
        uVar5 = 0xc56;
      }
      else {
        for (uVar4 = 0; uVar4 < uVar7; uVar4 = uVar4 + 1) {
          sorted_index[uVar4] = -1;
        }
        n = 0;
        for (lVar8 = 0; lVar8 < pRVar1->max; lVar8 = lVar8 + 1) {
          if (-1 < pRVar1->global[lVar8]) {
            uVar2 = ref_matrix_diag_m(metric,diag_system);
            if (uVar2 != 0) {
              pcVar6 = "decomp";
              uVar5 = 0xc59;
              goto LAB_001b838a;
            }
            auVar10._8_8_ = -diag_system[1];
            auVar10._0_8_ = -diag_system[0];
            auVar10 = maxpd(diag_system._0_16_,auVar10);
            dVar9 = auVar10._0_8_;
            if (auVar10._0_8_ <= auVar10._8_8_) {
              dVar9 = auVar10._8_8_;
            }
            RVar11 = diag_system[2];
            if (diag_system[2] <= -diag_system[2]) {
              RVar11 = -diag_system[2];
            }
            if (dVar9 <= RVar11) {
              dVar9 = RVar11;
            }
            original[(int)n] = dVar9;
            n = n + 1;
          }
          metric = metric + 6;
        }
        if (pRVar1->n != n) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xc5f,"ref_metric_histogram","node count",(long)pRVar1->n,(long)(int)n);
          goto LAB_001b821e;
        }
        uVar2 = ref_sort_heap_dbl(n,original,sorted_index);
        if (uVar2 != 0) {
          pcVar6 = "sort";
          uVar5 = 0xc60;
LAB_001b838a:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar5,"ref_metric_histogram",(ulong)uVar2,pcVar6);
          return uVar2;
        }
        __s = fopen(filename,"w");
        if (__s != (FILE *)0x0) {
          fwrite("title=\"tecplot ordered max eig\"\n",0x20,1,__s);
          fwrite("variables = \"i\" \"e\"\n",0x14,1,__s);
          fwrite("zone t=\"eig\"\n",0xd,1,__s);
          uVar4 = 0;
          uVar7 = (ulong)n;
          if ((int)n < 1) {
            uVar7 = uVar4;
          }
          for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
            fprintf(__s,"%d %e\n",original[sorted_index[uVar4]],uVar4 & 0xffffffff);
          }
          fclose(__s);
          free(sorted_index);
          free(original);
          return 0;
        }
        printf("unable to open %s\n",filename);
        pcVar6 = "unable to open file";
        uVar5 = 0xc64;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar5,
           "ref_metric_histogram",pcVar6);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_histogram(REF_DBL *metric, REF_GRID ref_grid,
                                        const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *eig, diag_system[12];
  REF_INT i, node, n, *sorted_index;
  FILE *file;

  ref_malloc_init(eig, ref_node_n(ref_node), REF_DBL, 0.0);
  ref_malloc_init(sorted_index, ref_node_n(ref_node), REF_INT, REF_EMPTY);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
    eig[n] = MAX(MAX(ABS(ref_matrix_eig(diag_system, 0)),
                     ABS(ref_matrix_eig(diag_system, 1))),
                 ABS(ref_matrix_eig(diag_system, 2)));
    n++;
  }
  REIS(ref_node_n(ref_node), n, "node count");
  RSS(ref_sort_heap_dbl(n, eig, sorted_index), "sort");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot ordered max eig\"\n");
  fprintf(file, "variables = \"i\" \"e\"\n");
  fprintf(file, "zone t=\"eig\"\n");
  for (i = 0; i < n; i++) {
    fprintf(file, "%d %e\n", i, eig[sorted_index[i]]);
  }
  fclose(file);
  ref_free(sorted_index);
  ref_free(eig);
  return REF_SUCCESS;
}